

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_err_msg(lysp_yin_ctx *ctx,void *parent,char **value,lysp_ext_instance **exts)

{
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  yin_subelement subelems [2];
  lysp_ext_instance **exts_local;
  char **value_local;
  void *parent_local;
  lysp_yin_ctx *ctx_local;
  
  memset(&ret___1,0,0x18);
  ret___1 = 0xf0000;
  subelems[0].flags = 5;
  subelems[0]._18_2_ = 0x35;
  subelems[1].dest._0_2_ = 7;
  subelems[1]._0_8_ = value;
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if (((ctx_local._4_4_ == LY_SUCCESS) &&
      (ctx_local._4_4_ =
            yin_parse_attribute(ctx,YIN_ARG_NONE,(char **)0x0,Y_MAYBE_STR_ARG,LY_STMT_ERROR_MESSAGE)
      , ctx_local._4_4_ == LY_SUCCESS)) &&
     (ctx_local._4_4_ =
           yin_parse_content(ctx,(yin_subelement *)&ret___1,2,parent,LY_STMT_ERROR_MESSAGE,
                             (char **)0x0,exts), ctx_local._4_4_ == LY_SUCCESS)) {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_err_msg(struct lysp_yin_ctx *ctx, const void *parent, const char **value, struct lysp_ext_instance **exts)
{
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
        {LY_STMT_ARG_VALUE, value, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE | YIN_SUBELEM_FIRST}
    };

    /* check attributes */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NONE, NULL, Y_MAYBE_STR_ARG, LY_STMT_ERROR_MESSAGE));

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), parent, LY_STMT_ERROR_MESSAGE, NULL, exts));

    return LY_SUCCESS;
}